

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

void __thiscall
ymfm::opl_registers_base<4>::operator_map(opl_registers_base<4> *this,operator_mapping *dest)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t fourop;
  operator_mapping *dest_local;
  opl_registers_base<4> *this_local;
  
  uVar1 = fourop_enable(this);
  uVar2 = bitfield(uVar1,0,1);
  uVar3 = fm_registers_base::operator_list('\0','\x03','\x06','\t');
  uVar4 = fm_registers_base::operator_list('\0','\x03',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[0] = uVar4;
  uVar2 = bitfield(uVar1,1,1);
  uVar3 = fm_registers_base::operator_list('\x01','\x04','\a','\n');
  uVar4 = fm_registers_base::operator_list('\x01','\x04',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[1] = uVar4;
  uVar2 = bitfield(uVar1,2,1);
  uVar3 = fm_registers_base::operator_list('\x02','\x05','\b','\v');
  uVar4 = fm_registers_base::operator_list('\x02','\x05',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[2] = uVar4;
  uVar2 = bitfield(uVar1,0,1);
  uVar3 = fm_registers_base::operator_list(0xff,0xff,0xff,0xff);
  uVar4 = fm_registers_base::operator_list('\x06','\t',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[3] = uVar4;
  uVar2 = bitfield(uVar1,1,1);
  uVar3 = fm_registers_base::operator_list(0xff,0xff,0xff,0xff);
  uVar4 = fm_registers_base::operator_list('\a','\n',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[4] = uVar4;
  uVar2 = bitfield(uVar1,2,1);
  uVar3 = fm_registers_base::operator_list(0xff,0xff,0xff,0xff);
  uVar4 = fm_registers_base::operator_list('\b','\v',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[5] = uVar4;
  uVar4 = fm_registers_base::operator_list('\f','\x0f',0xff,0xff);
  dest->chan[6] = uVar4;
  uVar4 = fm_registers_base::operator_list('\r','\x10',0xff,0xff);
  dest->chan[7] = uVar4;
  uVar4 = fm_registers_base::operator_list('\x0e','\x11',0xff,0xff);
  dest->chan[8] = uVar4;
  uVar2 = bitfield(uVar1,3,1);
  uVar3 = fm_registers_base::operator_list('\x12','\x15','\x18','\x1b');
  uVar4 = fm_registers_base::operator_list('\x12','\x15',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[9] = uVar4;
  uVar2 = bitfield(uVar1,4,1);
  uVar3 = fm_registers_base::operator_list('\x13','\x16','\x19','\x1c');
  uVar4 = fm_registers_base::operator_list('\x13','\x16',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[10] = uVar4;
  uVar2 = bitfield(uVar1,5,1);
  uVar3 = fm_registers_base::operator_list('\x14','\x17','\x1a','\x1d');
  uVar4 = fm_registers_base::operator_list('\x14','\x17',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[0xb] = uVar4;
  uVar2 = bitfield(uVar1,3,1);
  uVar3 = fm_registers_base::operator_list(0xff,0xff,0xff,0xff);
  uVar4 = fm_registers_base::operator_list('\x18','\x1b',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[0xc] = uVar4;
  uVar2 = bitfield(uVar1,4,1);
  uVar3 = fm_registers_base::operator_list(0xff,0xff,0xff,0xff);
  uVar4 = fm_registers_base::operator_list('\x19','\x1c',0xff,0xff);
  if (uVar2 != 0) {
    uVar4 = uVar3;
  }
  dest->chan[0xd] = uVar4;
  uVar1 = bitfield(uVar1,5,1);
  uVar2 = fm_registers_base::operator_list(0xff,0xff,0xff,0xff);
  uVar4 = fm_registers_base::operator_list('\x1a','\x1d',0xff,0xff);
  if (uVar1 != 0) {
    uVar4 = uVar2;
  }
  dest->chan[0xe] = uVar4;
  uVar4 = fm_registers_base::operator_list('\x1e','!',0xff,0xff);
  dest->chan[0xf] = uVar4;
  uVar4 = fm_registers_base::operator_list('\x1f','\"',0xff,0xff);
  dest->chan[0x10] = uVar4;
  uVar4 = fm_registers_base::operator_list(' ','#',0xff,0xff);
  dest->chan[0x11] = uVar4;
  return;
}

Assistant:

void opl_registers_base<Revision>::operator_map(operator_mapping &dest) const
{
	if (Revision <= 2)
	{
		// OPL/OPL2 has a fixed map, all 2 operators
		static const operator_mapping s_fixed_map =
		{ {
			operator_list(  0,  3 ),  // Channel 0 operators
			operator_list(  1,  4 ),  // Channel 1 operators
			operator_list(  2,  5 ),  // Channel 2 operators
			operator_list(  6,  9 ),  // Channel 3 operators
			operator_list(  7, 10 ),  // Channel 4 operators
			operator_list(  8, 11 ),  // Channel 5 operators
			operator_list( 12, 15 ),  // Channel 6 operators
			operator_list( 13, 16 ),  // Channel 7 operators
			operator_list( 14, 17 ),  // Channel 8 operators
		} };
		dest = s_fixed_map;
	}
	else
	{
		// OPL3/OPL4 can be configured for 2 or 4 operators
		uint32_t fourop = fourop_enable();

		dest.chan[ 0] = bitfield(fourop, 0) ? operator_list(  0,  3,  6,  9 ) : operator_list(  0,  3 );
		dest.chan[ 1] = bitfield(fourop, 1) ? operator_list(  1,  4,  7, 10 ) : operator_list(  1,  4 );
		dest.chan[ 2] = bitfield(fourop, 2) ? operator_list(  2,  5,  8, 11 ) : operator_list(  2,  5 );
		dest.chan[ 3] = bitfield(fourop, 0) ? operator_list() : operator_list(  6,  9 );
		dest.chan[ 4] = bitfield(fourop, 1) ? operator_list() : operator_list(  7, 10 );
		dest.chan[ 5] = bitfield(fourop, 2) ? operator_list() : operator_list(  8, 11 );
		dest.chan[ 6] = operator_list( 12, 15 );
		dest.chan[ 7] = operator_list( 13, 16 );
		dest.chan[ 8] = operator_list( 14, 17 );

		dest.chan[ 9] = bitfield(fourop, 3) ? operator_list( 18, 21, 24, 27 ) : operator_list( 18, 21 );
		dest.chan[10] = bitfield(fourop, 4) ? operator_list( 19, 22, 25, 28 ) : operator_list( 19, 22 );
		dest.chan[11] = bitfield(fourop, 5) ? operator_list( 20, 23, 26, 29 ) : operator_list( 20, 23 );
		dest.chan[12] = bitfield(fourop, 3) ? operator_list() : operator_list( 24, 27 );
		dest.chan[13] = bitfield(fourop, 4) ? operator_list() : operator_list( 25, 28 );
		dest.chan[14] = bitfield(fourop, 5) ? operator_list() : operator_list( 26, 29 );
		dest.chan[15] = operator_list( 30, 33 );
		dest.chan[16] = operator_list( 31, 34 );
		dest.chan[17] = operator_list( 32, 35 );
	}
}